

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
ready_to_deregister_notify
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this,coop_t *coop)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  coop_t *coop_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
  *this_local;
  
  lock._M_device = (mutex_type *)coop;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&(this->m_sync_objects).m_lock);
  std::deque<so_5::coop_t_*,_std::allocator<so_5::coop_t_*>_>::push_back
            (&this->m_final_dereg_coops,(value_type *)&lock);
  wakeup_if_waiting(&this->m_sync_objects);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::ready_to_deregister_notify(
	coop_t * coop )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );
		m_final_dereg_coops.push_back( coop );

		wakeup_if_waiting( m_sync_objects );
	}